

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgenfil.cpp
# Opt level: O1

void CTcIdFixup::load_object_file
               (CVmFile *fp,void *xlat,ulong xlat_cnt,tcgen_xlat_type xlat_type,
               size_t stream_element_size,textchar_t *fname,CTcIdFixup **fixup_list_head)

{
  CTcDataStream *this;
  ulong uVar1;
  size_t len;
  ulong uVar2;
  ulong ofs;
  char b [4];
  undefined4 local_64;
  ulong local_60;
  void *local_58;
  uint local_50;
  undefined1 uStack_4c;
  uint local_4b;
  tcgen_xlat_type local_44;
  size_t local_40;
  ulong local_38;
  
  local_58 = xlat;
  local_44 = xlat_type;
  local_40 = stream_element_size;
  local_38 = xlat_cnt;
  CVmFile::read_bytes(fp,(char *)&local_50,4);
  uVar2 = (ulong)local_50;
  do {
    if (uVar2 == 0) {
      return;
    }
    CVmFile::read_bytes(fp,(char *)&local_50,9);
    this = CTcDataStream::get_stream_from_id((char)local_50,fname);
    if (this != (CTcDataStream *)0x0) {
      uVar1 = (ulong)local_4b;
      ofs = (ulong)CONCAT13(uStack_4c,local_50._1_3_) + this->obj_file_start_ofs_;
      if (local_58 != (void *)0x0) {
        if (local_38 <= uVar1) {
          CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2e22,fname);
          goto LAB_001d2c12;
        }
        if (local_44 == TCGEN_XLAT_ENUM) {
          local_60 = *(ulong *)((long)local_58 + uVar1 * 8);
        }
        else if (local_44 == TCGEN_XLAT_PROP) {
          local_60 = (ulong)*(ushort *)((long)local_58 + uVar1 * 2);
        }
        else if (local_44 == TCGEN_XLAT_OBJ) {
          local_60 = (ulong)*(uint *)((long)local_58 + uVar1 * 4);
        }
        if (local_40 == 2) {
          local_64 = CONCAT22(local_64._2_2_,(short)local_60);
          len = 2;
        }
        else {
          local_64 = (undefined4)local_60;
          len = 4;
        }
        CTcDataStream::write_at(this,ofs,(char *)&local_64,len);
        uVar1 = local_60;
      }
      local_60 = uVar1;
      if (fixup_list_head != (CTcIdFixup **)0x0) {
        add_fixup(fixup_list_head,this,ofs,local_60);
      }
    }
LAB_001d2c12:
    uVar2 = uVar2 - 1;
  } while( true );
}

Assistant:

void CTcIdFixup::load_object_file(CVmFile *fp,
                                  const void *xlat,
                                  ulong xlat_cnt,
                                  tcgen_xlat_type xlat_type,
                                  size_t stream_element_size,
                                  const textchar_t *fname,
                                  CTcIdFixup **fixup_list_head)
{
    ulong cnt;

    /* read the count, then read the fixups */
    for (cnt = fp->read_uint4() ; cnt != 0 ; --cnt)
    {
        char buf[9];
        ulong ofs;
        ulong old_id;
        ulong new_id;
        CTcDataStream *stream;

        /* read the next fixup */
        fp->read_bytes(buf, 9);
        stream = CTcDataStream::get_stream_from_id(buf[0], fname);
        ofs = t3rp4u(buf+1);
        old_id = t3rp4u(buf+5);

        /* if the stream was invalid, ignore this record */
        if (stream == 0)
            continue;

        /* adjust the offset for the stream's start in this object file */
        ofs += stream->get_object_file_start_ofs();

        /* apply the fixup if a translation table was provided */
        if (xlat != 0)
        {
            /* make sure the count is in range - if it's not, ignore it */
            if (old_id >= xlat_cnt)
            {
                /* note the problem */
                G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                                    TCERR_OBJFILE_INVAL_OBJ_ID, fname);

                /* ignore the record */
                continue;
            }

            /* look up the new ID */
            switch(xlat_type)
            {
            case TCGEN_XLAT_OBJ:
                new_id = ((const tctarg_obj_id_t *)xlat)[old_id];
                break;

            case TCGEN_XLAT_PROP:
                new_id = ((const tctarg_prop_id_t *)xlat)[old_id];
                break;

            case TCGEN_XLAT_ENUM:
                new_id = ((const ulong *)xlat)[old_id];
                break;
            }

            /* apply the fixup */
            if (stream_element_size == 2)
                stream->write2_at(ofs, (uint)new_id);
            else
                stream->write4_at(ofs, new_id);
        }
        else
        {
            /* use the original ID for now */
            new_id = old_id;
        }

        /* 
         *   If we're keeping object fixups in the new file, create a fixup
         *   for the reference.  Note that the fixup is for the new ID, not
         *   the old ID, because we've already translated the value in the
         *   stream to the new ID.  
         */
        if (fixup_list_head != 0)
            CTcIdFixup::add_fixup(fixup_list_head, stream, ofs, new_id);
    }
}